

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta,double objective_amplifier)

{
  uint *args_1;
  undefined1 auVar1 [16];
  uint uVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  uint local_88;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  double theta_local;
  double delta_local;
  double kappa_local;
  undefined1 extraout_var [56];
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  theta_local = theta;
  delta_local = delta;
  kappa_local = kappa;
  debug_logger<true>::log<double,double,double>
            ((debug_logger<true> *)this,fmt,&kappa_local,&delta_local,&theta_local);
  bVar5 = false;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    k = *first._M_current;
    sparse_matrix<int>::row((sparse_matrix<int> *)&it,(int)this + 0x10);
    solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
    ::decrease_preference
              ((solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                *)this,it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,
               (row_iterator)
               it.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
               .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
               super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl,
               theta_local);
    local_88 = solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                           *)this,it.
                                  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                                  .
                                  super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                  ._M_head_impl,
                          (row_iterator)
                          it.
                          super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
                          super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                          _M_head_impl,x);
    uVar7 = (ulong)local_88;
    for (lVar6 = 0; uVar2 = local_88, uVar7 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
      auVar8._0_8_ = quadratic_cost_type<double>::operator()
                               (*(quadratic_cost_type<double> **)(this + 0x70),
                                *(int *)(*(long *)(this + 0x58) + 8 + lVar6),x);
      auVar8._8_56_ = extraout_var;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = objective_amplifier;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(*(long *)(this + 0x58) + lVar6);
      auVar1 = vfmadd213sd_fma(auVar8._0_16_,auVar9,auVar1);
      *(long *)(*(long *)(this + 0x58) + lVar6) = auVar1._0_8_;
    }
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*>
              (*(rc_data **)(this + 0x58),*(rc_data **)(this + 0x58) + (int)local_88,
               *(random_engine **)(this + 8));
    args_1 = (uint *)(*(long *)(this + 0x60) + (long)k * 4);
    uVar4 = *args_1;
    if ((int)uVar2 < (int)uVar4) {
      uVar4 = uVar2;
    }
    selected = uVar4 - 1;
    fmt_00._M_str = "constraints {}: {} = ";
    fmt_00._M_len = 0x15;
    debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&k,(int *)args_1);
    for (lVar6 = 0; (ulong)(~((int)uVar2 >> 0x1f) & uVar2) << 4 != lVar6; lVar6 = lVar6 + 0x10) {
      fmt_01._M_str = "{} ({}) ";
      fmt_01._M_len = 8;
      debug_logger<true>::log<double,int>
                ((debug_logger<true> *)this,fmt_01,(double *)(*(long *)(this + 0x58) + lVar6),
                 (int *)(*(long *)(this + 0x58) + 8 + lVar6));
    }
    fmt_02._M_str = " => Selected: {}\n";
    fmt_02._M_len = 0x11;
    debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&selected);
    bVar3 = affect<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                      ((solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                        *)this,x,
                       it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,k,selected,local_88,kappa_local,delta_local);
    bVar5 = (bool)(bVar5 | bVar3);
  }
  return bVar5;
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }